

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.c++
# Opt level: O1

void __thiscall
capnp::_::anon_unknown_0::RpcConnectionState::PromiseClient::resolve
          (PromiseClient *this,Own<capnp::ClientHook> *replacement,bool isError)

{
  RpcConnectionState *pRVar1;
  undefined8 *puVar2;
  ClientHook *pCVar3;
  uint *puVar4;
  ArrayDisposer *pAVar5;
  RemoveConst<capnp::_::(anonymous_namespace)::RpcConnectionState::Embargo> *pRVar6;
  Disposer *pDVar7;
  PromiseFulfiller<void> *pPVar8;
  CapTableBuilder *pCVar9;
  undefined4 uVar10;
  WirePointer *pWVar11;
  undefined4 uVar12;
  void **ppvVar13;
  long *plVar14;
  int iVar15;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Embargo *pEVar16;
  Exception *pEVar17;
  TransformPromiseNodeBase *this_00;
  ulong uVar18;
  Embargo *pEVar19;
  Exception *pEVar20;
  Embargo *pEVar21;
  Own<capnp::ClientHook> OVar22;
  PromiseFulfillerPair<void> paf;
  Maybe<kj::Own<capnp::ClientHook>_> redirect;
  Own<capnp::OutgoingRpcMessage> message;
  PromiseForResult<kj::CaptureByMove<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_rpc_c__:986:40),_kj::Own<capnp::ClientHook>_>,_void>
  embargoPromise;
  Builder disembargo;
  StructBuilder local_f8;
  Exception *local_c8;
  Exception *pEStack_c0;
  WirePointer *local_b8;
  void **local_b0;
  undefined8 *local_a8;
  long *local_a0;
  PointerBuilder local_98;
  StructBuilder local_80;
  StructBuilder local_58;
  
  iVar15 = (*replacement->ptr->_vptr_ClientHook[5])();
  pRVar1 = (this->super_RpcClient).connectionState.ptr;
  if ((((RpcConnectionState *)CONCAT44(extraout_var,iVar15) !=
        (RpcConnectionState *)&ClientHook::NULL_CAPABILITY_BRAND &&
        (RpcConnectionState *)CONCAT44(extraout_var,iVar15) != pRVar1) &&
      (this->receivedCall == true && !isError)) && ((pRVar1->connection).tag == 1)) {
    puVar2 = *(undefined8 **)((long)&(pRVar1->connection).field_1 + 8);
    (**(code **)*puVar2)(&local_a8,puVar2,0x19);
    (**(code **)*local_a0)(&local_c8);
    local_98.pointer = local_b8;
    local_98.segment = (SegmentBuilder *)local_c8;
    local_98.capTable = (CapTableBuilder *)pEStack_c0;
    PointerBuilder::initStruct(&local_f8,&local_98,(StructSize)0x10001);
    *(undefined2 *)local_f8.data = 0xd;
    local_98.segment = local_f8.segment;
    local_98.capTable = local_f8.capTable;
    local_98.pointer = local_f8.pointers;
    PointerBuilder::initStruct(&local_58,&local_98,(StructSize)0x10001);
    pRVar1 = (this->super_RpcClient).connectionState.ptr;
    pCVar3 = (this->cap).ptr;
    local_f8.segment = local_58.segment;
    local_f8.capTable = local_58.capTable;
    local_f8.data = local_58.pointers;
    PointerBuilder::initStruct(&local_80,(PointerBuilder *)&local_f8,(StructSize)0x10001);
    local_f8.dataSize = local_80.dataSize;
    local_f8.pointerCount = local_80.pointerCount;
    local_f8._38_2_ = local_80._38_2_;
    local_f8.data = (void *)CONCAT44(local_80.data._4_4_,local_80.data._0_4_);
    local_f8.pointers._0_4_ = local_80.pointers._0_4_;
    local_f8.pointers._4_4_ = local_80.pointers._4_4_;
    local_f8.segment = (SegmentBuilder *)CONCAT44(local_80.segment._4_4_,local_80.segment._0_4_);
    local_f8.capTable = (CapTableBuilder *)CONCAT44(local_80.capTable._4_4_,local_80.capTable._0_4_)
    ;
    iVar15 = (*pCVar3->_vptr_ClientHook[5])(pCVar3);
    if ((RpcConnectionState *)CONCAT44(extraout_var_00,iVar15) == pRVar1) {
      (*pCVar3->_vptr_ClientHook[8])(&local_c8);
    }
    else {
      (*pCVar3->_vptr_ClientHook[4])(&local_98);
      local_c8 = (Exception *)local_98.segment;
      pEStack_c0 = (Exception *)local_98.capTable;
    }
    if (pEStack_c0 != (Exception *)0x0) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[67]>
                ((Fault *)&local_f8,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc.c++"
                 ,0x3cd,FAILED,"redirect == nullptr",
                 "\"Original promise target should always be from this RPC connection.\"",
                 (char (*) [67])"Original promise target should always be from this RPC connection."
                );
      kj::_::Debug::Fault::fatal((Fault *)&local_f8);
    }
    pRVar1 = (this->super_RpcClient).connectionState.ptr;
    puVar4 = (pRVar1->embargoes).freeIds.c.
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (puVar4 == (pRVar1->embargoes).freeIds.c.
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_finish) {
      pEVar21 = (pRVar1->embargoes).slots.builder.ptr;
      pEVar16 = (pRVar1->embargoes).slots.builder.pos;
      uVar18 = (long)pEVar16 - (long)pEVar21 >> 4;
      pEVar19 = (pRVar1->embargoes).slots.builder.endPtr;
      if (pEVar16 == pEVar19) {
        local_b0 = (void **)4;
        if (pEVar19 != pEVar21) {
          local_b0 = (void **)((long)pEVar19 - (long)pEVar21 >> 3);
        }
        if (local_b0 < uVar18) {
          pEVar21 = pEVar21 + (long)local_b0;
          while (pEVar21 < pEVar16) {
            (pRVar1->embargoes).slots.builder.pos = pEVar16 + -1;
            if (pEVar16[-1].fulfiller.ptr.ptr != (PromiseFulfiller<void> *)0x0) {
              pEVar16[-1].fulfiller.ptr.ptr = (PromiseFulfiller<void> *)0x0;
              (**(pEVar16[-1].fulfiller.ptr.disposer)->_vptr_Disposer)();
            }
            pEVar16 = (pRVar1->embargoes).slots.builder.pos;
          }
        }
        ppvVar13 = local_b0;
        pEVar17 = (Exception *)
                  kj::_::HeapArrayDisposer::allocateImpl
                            (0x10,0,(size_t)local_b0,(_func_void_void_ptr *)0x0,
                             (_func_void_void_ptr *)0x0);
        local_f8.data = pEVar17->trace + (long)ppvVar13 * 2 + -10;
        local_f8.pointers._0_4_ = 0x651e68;
        local_f8.pointers._4_4_ = 0;
        pEVar16 = (pRVar1->embargoes).slots.builder.pos;
        pEVar21 = (pRVar1->embargoes).slots.builder.ptr;
        pEVar20 = pEVar17;
        for (pEVar19 = pEVar21; pEVar19 != pEVar16; pEVar19 = pEVar19 + 1) {
          (pEVar20->ownFile).content.ptr = (char *)(pEVar19->fulfiller).ptr.disposer;
          (pEVar20->ownFile).content.size_ = (size_t)(pEVar19->fulfiller).ptr.ptr;
          (pEVar19->fulfiller).ptr.ptr = (PromiseFulfiller<void> *)0x0;
          pEVar20 = (Exception *)&(pEVar20->ownFile).content.disposer;
        }
        local_f8.segment = (SegmentBuilder *)pEVar17;
        local_f8.capTable = (CapTableBuilder *)pEVar20;
        local_b0 = (void **)local_f8.data;
        if (pEVar21 != (Embargo *)0x0) {
          pEVar19 = (pRVar1->embargoes).slots.builder.endPtr;
          (pRVar1->embargoes).slots.builder.ptr = (Embargo *)0x0;
          (pRVar1->embargoes).slots.builder.pos =
               (RemoveConst<capnp::_::(anonymous_namespace)::RpcConnectionState::Embargo> *)0x0;
          (pRVar1->embargoes).slots.builder.endPtr = (Embargo *)0x0;
          pAVar5 = (pRVar1->embargoes).slots.builder.disposer;
          (**pAVar5->_vptr_ArrayDisposer)
                    (pAVar5,pEVar21,0x10,(long)pEVar16 - (long)pEVar21 >> 4,
                     (long)pEVar19 - (long)pEVar21 >> 4,
                     kj::ArrayDisposer::
                     Dispose_<capnp::_::(anonymous_namespace)::RpcConnectionState::Embargo,_false>::
                     destruct);
        }
        (pRVar1->embargoes).slots.builder.ptr = (Embargo *)pEVar17;
        (pRVar1->embargoes).slots.builder.pos =
             (RemoveConst<capnp::_::(anonymous_namespace)::RpcConnectionState::Embargo> *)pEVar20;
        (pRVar1->embargoes).slots.builder.endPtr = (Embargo *)local_b0;
        (pRVar1->embargoes).slots.builder.disposer =
             (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
      }
      pRVar6 = (pRVar1->embargoes).slots.builder.pos;
      (pRVar6->fulfiller).ptr.disposer = (Disposer *)0x0;
      (pRVar6->fulfiller).ptr.ptr = (PromiseFulfiller<void> *)0x0;
      pEVar21 = (pRVar1->embargoes).slots.builder.pos;
      (pRVar1->embargoes).slots.builder.pos = pEVar21 + 1;
    }
    else {
      uVar18 = (ulong)*puVar4;
      std::
      priority_queue<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::greater<unsigned_int>_>
      ::pop(&(pRVar1->embargoes).freeIds);
      pEVar21 = (pRVar1->embargoes).slots.builder.ptr + uVar18;
    }
    *(undefined2 *)((long)local_58.data + 4) = 0;
    *(int *)local_58.data = (int)uVar18;
    kj::newPromiseAndFulfiller<void>();
    uVar12 = local_f8.pointers._4_4_;
    uVar10 = local_f8.pointers._0_4_;
    local_f8.pointers = (WirePointer *)0x0;
    pDVar7 = (pEVar21->fulfiller).ptr.disposer;
    pPVar8 = (pEVar21->fulfiller).ptr.ptr;
    *(undefined4 *)&(pEVar21->fulfiller).ptr.disposer = local_f8.data._0_4_;
    *(undefined4 *)((long)&(pEVar21->fulfiller).ptr.disposer + 4) = local_f8.data._4_4_;
    *(undefined4 *)&(pEVar21->fulfiller).ptr.ptr = uVar10;
    *(undefined4 *)((long)&(pEVar21->fulfiller).ptr.ptr + 4) = uVar12;
    if (pPVar8 != (PromiseFulfiller<void> *)0x0) {
      (**pDVar7->_vptr_Disposer)
                (pDVar7,(_func_int *)
                        ((long)&pPVar8->_vptr_PromiseFulfiller +
                        (long)pPVar8->_vptr_PromiseFulfiller[-2]));
    }
    pDVar7 = replacement->disposer;
    pCVar3 = replacement->ptr;
    replacement->ptr = (ClientHook *)0x0;
    this_00 = (TransformPromiseNodeBase *)operator_new(0x40);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (this_00,(Own<kj::_::PromiseNode> *)&local_f8,
               kj::
               CaptureByMove<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc.c++:986:40),_kj::Own<capnp::ClientHook>_>
               ::operator()<>);
    (this_00->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_00644b10;
    this_00[1].dependency.disposer = pDVar7;
    this_00[1].dependency.ptr = (PromiseNode *)pCVar3;
    local_98.segment =
         (SegmentBuilder *)
         &kj::_::
          HeapDisposer<kj::_::TransformPromiseNode<kj::Own<capnp::ClientHook>,kj::_::Void,kj::CaptureByMove<capnp::_::(anonymous_namespace)::RpcConnectionState::PromiseClient::resolve(kj::Own<capnp::ClientHook>,bool)::{lambda(kj::Own<capnp::ClientHook>&&)#1},kj::Own<capnp::ClientHook>>,kj::_::PropagateException>>
          ::instance;
    local_98.capTable = (CapTableBuilder *)this_00;
    OVar22 = newLocalPromiseClient
                       ((capnp *)&local_c8,(Promise<kj::Own<capnp::ClientHook>_> *)&local_98);
    pDVar7 = replacement->disposer;
    pCVar3 = replacement->ptr;
    replacement->disposer = (Disposer *)local_c8;
    replacement->ptr = (ClientHook *)pEStack_c0;
    pEStack_c0 = (Exception *)0x0;
    if (pCVar3 != (ClientHook *)0x0) {
      (**pDVar7->_vptr_Disposer)
                (pDVar7,(_func_int *)
                        ((long)&pCVar3->_vptr_ClientHook + (long)pCVar3->_vptr_ClientHook[-2]),
                 OVar22.ptr);
    }
    pEVar20 = pEStack_c0;
    if (pEStack_c0 != (Exception *)0x0) {
      pEStack_c0 = (Exception *)0x0;
      (*(code *)((Disposer *)(local_c8->ownFile).content.ptr)->_vptr_Disposer)
                (local_c8,(code *)((long)pEVar20->trace +
                                  (long)(((Disposer *)(pEVar20->ownFile).content.ptr)[-2].
                                         _vptr_Disposer + -10)));
    }
    (**(code **)(*local_a0 + 8))();
    pCVar9 = local_98.capTable;
    if ((TransformPromiseNodeBase *)local_98.capTable != (TransformPromiseNodeBase *)0x0) {
      local_98.capTable = (CapTableBuilder *)0x0;
      (*(code *)(((local_98.segment)->super_SegmentReader).arena)->_vptr_Arena)
                (local_98.segment,
                 (_func_int *)
                 ((long)&((PromiseNode *)&pCVar9->super_CapTableReader)->_vptr_PromiseNode +
                 (long)((PromiseNode *)&pCVar9->super_CapTableReader)->_vptr_PromiseNode[-2]));
    }
    pWVar11 = local_f8.pointers;
    if (local_f8.pointers != (WirePointer *)0x0) {
      local_f8.pointers = (WirePointer *)0x0;
      (*(code *)**local_f8.data)
                (local_f8.data,
                 (long)&(pWVar11->offsetAndKind).value + *(long *)((long)*pWVar11 + -0x10));
    }
    pCVar9 = local_f8.capTable;
    if ((Exception *)local_f8.capTable != (Exception *)0x0) {
      local_f8.capTable = (CapTableBuilder *)0x0;
      (*(code *)((Disposer *)(((String *)&(local_f8.segment)->super_SegmentReader)->content).ptr)->
                _vptr_Disposer)
                (local_f8.segment,
                 (code *)((long)((long)pCVar9 + 0x50) +
                         (long)(((Disposer *)
                                (((String *)&pCVar9->super_CapTableReader)->content).ptr)[-2].
                                _vptr_Disposer + -10)));
    }
    plVar14 = local_a0;
    if (local_a0 != (long *)0x0) {
      local_a0 = (long *)0x0;
      (**(code **)*local_a8)(local_a8,(long)plVar14 + *(long *)(*plVar14 + -0x10));
    }
  }
  pDVar7 = (this->cap).disposer;
  pCVar3 = (this->cap).ptr;
  (this->cap).disposer = replacement->disposer;
  (this->cap).ptr = replacement->ptr;
  replacement->ptr = (ClientHook *)0x0;
  if (pCVar3 != (ClientHook *)0x0) {
    (**pDVar7->_vptr_Disposer)
              (pDVar7,(_func_int *)
                      ((long)&pCVar3->_vptr_ClientHook + (long)pCVar3->_vptr_ClientHook[-2]));
  }
  this->isResolved = true;
  return;
}

Assistant:

void resolve(kj::Own<ClientHook> replacement, bool isError) {
      const void* replacementBrand = replacement->getBrand();
      if (replacementBrand != connectionState.get() &&
          replacementBrand != &ClientHook::NULL_CAPABILITY_BRAND &&
          receivedCall && !isError && connectionState->connection.is<Connected>()) {
        // The new capability is hosted locally, not on the remote machine.  And, we had made calls
        // to the promise.  We need to make sure those calls echo back to us before we allow new
        // calls to go directly to the local capability, so we need to set a local embargo and send
        // a `Disembargo` to echo through the peer.

        auto message = connectionState->connection.get<Connected>()->newOutgoingMessage(
            messageSizeHint<rpc::Disembargo>() + MESSAGE_TARGET_SIZE_HINT);

        auto disembargo = message->getBody().initAs<rpc::Message>().initDisembargo();

        {
          auto redirect = connectionState->writeTarget(*cap, disembargo.initTarget());
          KJ_ASSERT(redirect == nullptr,
                    "Original promise target should always be from this RPC connection.");
        }

        EmbargoId embargoId;
        Embargo& embargo = connectionState->embargoes.next(embargoId);

        disembargo.getContext().setSenderLoopback(embargoId);

        auto paf = kj::newPromiseAndFulfiller<void>();
        embargo.fulfiller = kj::mv(paf.fulfiller);

        // Make a promise which resolves to `replacement` as soon as the `Disembargo` comes back.
        auto embargoPromise = paf.promise.then(
            kj::mvCapture(replacement, [](kj::Own<ClientHook>&& replacement) {
              return kj::mv(replacement);
            }));

        // We need to queue up calls in the meantime, so we'll resolve ourselves to a local promise
        // client instead.
        replacement = newLocalPromiseClient(kj::mv(embargoPromise));

        // Send the `Disembargo`.
        message->send();
      }

      cap = kj::mv(replacement);
      isResolved = true;
    }